

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFraigPartitioned(Vec_Ptr_t *vStore,void *pParams)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *vOuts;
  void *__ptr;
  int iVar4;
  Vec_Ptr_t *__ptr_00;
  Abc_Frame_t *pAVar5;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar6;
  Vec_Ptr_t *vParts;
  void **ppvVar7;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pAVar8;
  Abc_Ntk_t *pAVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (vStore->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar9 = (Abc_Ntk_t *)*vStore->pArray;
  if (pAVar9->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x453,"Abc_Ntk_t *Abc_NtkFraigPartitioned(Vec_Ptr_t *, void *)");
  }
  ppvVar7 = (void **)0x0;
  __ptr_00 = Abc_NtkPartitionSmart(pAVar9,300,0);
  pAVar5 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar5,"unset progressbar");
  vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
  vOutsPtr->nCap = 1000;
  vOutsPtr->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  vOutsPtr->pArray = ppvVar6;
  uVar1 = __ptr_00->nSize;
  uVar12 = (ulong)uVar1;
  vParts = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar1 - 1) {
    uVar10 = uVar1;
  }
  vParts->nSize = 0;
  vParts->nCap = uVar10;
  if (uVar10 != 0) {
    ppvVar7 = (void **)malloc((long)(int)uVar10 << 3);
  }
  vParts->pArray = ppvVar7;
  if (0 < (int)uVar1) {
    ppvVar6 = __ptr_00->pArray;
    uVar13 = 0;
    do {
      vOuts = (Vec_Int_t *)ppvVar6[uVar13];
      Abc_NtkConvertCos(pAVar9,vOuts,vOutsPtr);
      pNtkNew = Abc_NtkCreateConeArray(pAVar9,vOutsPtr,0);
      if (1 < vStore->nSize) {
        lVar11 = 1;
        do {
          pAVar8 = (Abc_Ntk_t *)vStore->pArray[lVar11];
          Abc_NtkConvertCos(pAVar8,vOuts,vOutsPtr);
          Abc_NtkAppendToCone(pNtkNew,pAVar8,vOutsPtr);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vStore->nSize);
      }
      uVar13 = uVar13 + 1;
      uVar10 = pNtkNew->vPis->nSize;
      uVar2 = pNtkNew->vPos->nSize;
      uVar3 = pNtkNew->nObjCounts[7];
      iVar4 = Abc_AigLevel(pNtkNew);
      printf("Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             uVar13 & 0xffffffff,uVar12,(ulong)uVar10,(ulong)uVar2,(ulong)uVar3,iVar4);
      pAVar8 = Abc_NtkFraig(pNtkNew,pParams,1,0);
      uVar10 = vParts->nSize;
      uVar2 = vParts->nCap;
      if (uVar10 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vParts->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vParts->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar2 * 2;
          if (iVar4 <= (int)uVar2) goto LAB_002ea91e;
          if (vParts->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vParts->pArray,(ulong)uVar2 << 4);
          }
        }
        vParts->pArray = ppvVar7;
        vParts->nCap = iVar4;
      }
LAB_002ea91e:
      vParts->nSize = uVar10 + 1;
      vParts->pArray[(int)uVar10] = pAVar8;
      Abc_NtkDelete(pNtkNew);
    } while (uVar13 != uVar12);
  }
  printf(
        "                                                                                          \r"
        );
  if (0 < (int)uVar1) {
    ppvVar6 = __ptr_00->pArray;
    uVar13 = 0;
    do {
      __ptr = ppvVar6[uVar13];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    free(__ptr_00);
  }
  pAVar5 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar5,"set progressbar");
  pAVar9 = Abc_NtkPartStitchChoices(pAVar9,vParts);
  iVar4 = vParts->nSize;
  if (0 < (long)iVar4) {
    ppvVar6 = vParts->pArray;
    lVar11 = 0;
    do {
      Abc_NtkDelete((Abc_Ntk_t *)ppvVar6[lVar11]);
      lVar11 = lVar11 + 1;
    } while (iVar4 != lVar11);
  }
  if (vParts->pArray != (void **)0x0) {
    free(vParts->pArray);
    vParts->pArray = (void **)0x0;
  }
  free(vParts);
  if (vOutsPtr->pArray != (void **)0x0) {
    free(vOutsPtr->pArray);
    vOutsPtr->pArray = (void **)0x0;
  }
  free(vOutsPtr);
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtk, * pNtk2, * pNtkAig, * pNtkFraig;
    int i, k;

    // perform partitioning
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // start the partition 
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        // add nodes to the partition
        Vec_PtrForEachEntryStart( Abc_Ntk_t *, vStore, pNtk2, k, 1 )
        {
            Abc_NtkConvertCos( pNtk2, vOne, vOnePtr );
            Abc_NtkAppendToCone( pNtkAig, pNtk2, vOnePtr );
        }
        printf( "Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pNtkAig), Abc_NtkPoNum(pNtkAig), 
            Abc_NtkNodeNum(pNtkAig), Abc_AigLevel(pNtkAig) );
        // fraig the partition
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 1, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    pNtkFraig = Abc_NtkPartStitchChoices( pNtk, vFraigs );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    return pNtkFraig;
}